

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_reader.c
# Opt level: O2

void sendOneToEachWriterRank(SstStream Stream,CMFormat f,void *Msg,void **WS_StreamPtr)

{
  uint uVar1;
  CMConnection p_Var2;
  int iVar3;
  long lVar4;
  long lVar5;
  
  if (Stream->WriterConfigParams->CPCommPattern == 1) {
    lVar4 = 0;
    while( true ) {
      uVar1 = *(uint *)((long)Stream->Peers + lVar4);
      lVar5 = (long)(int)uVar1;
      if (lVar5 == -1) break;
      p_Var2 = Stream->ConnectionsToWriter[lVar5].CMconn;
      *WS_StreamPtr = Stream->ConnectionsToWriter[lVar5].RemoteStreamID;
      iVar3 = CMwrite(p_Var2,f,Msg);
      if ((iVar3 != 1) && (Stream->Status < PeerClosed)) {
        CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer %d (%p)\n",(ulong)uVar1,
                   *WS_StreamPtr);
      }
      lVar4 = lVar4 + 4;
    }
  }
  else if (Stream->Rank == 0) {
    p_Var2 = Stream->ConnectionsToWriter->CMconn;
    *WS_StreamPtr = Stream->ConnectionsToWriter->RemoteStreamID;
    iVar3 = CMwrite(p_Var2,f,Msg);
    if ((iVar3 != 1) && (Stream->Status < PeerClosed)) {
      CP_verbose(Stream,CriticalVerbose,"Message failed to send to writer %d (%p)\n",0,*WS_StreamPtr
                );
      return;
    }
  }
  return;
}

Assistant:

static void sendOneToEachWriterRank(SstStream Stream, CMFormat f, void *Msg, void **WS_StreamPtr)
{
    if (Stream->WriterConfigParams->CPCommPattern == SstCPCommPeer)
    {
        int i = 0;
        while (Stream->Peers[i] != -1)
        {
            int peer = Stream->Peers[i];
            CMConnection conn = Stream->ConnectionsToWriter[peer].CMconn;
            /* add the writer Stream identifier to each outgoing
             * message */
            *WS_StreamPtr = Stream->ConnectionsToWriter[peer].RemoteStreamID;
            if (CMwrite(conn, f, Msg) != 1)
            {
                switch (Stream->Status)
                {
                case NotOpen:
                case Opening:
                case Established:
                    CP_verbose(Stream, CriticalVerbose,
                               "Message failed to send to writer %d (%p)\n", peer,
                               (void *)*WS_StreamPtr);
                    break;
                case PeerClosed:
                case PeerFailed:
                case Closed:
                case Destroyed:
                    // Don't warn on send failures for closing/closed clients
                    break;
                }
            }
            i++;
        }
    }
    else
    {
        if (Stream->Rank == 0)
        {
            int peer = 0;
            CMConnection conn = Stream->ConnectionsToWriter[peer].CMconn;
            /* add the writer Stream identifier to each outgoing
             * message */
            *WS_StreamPtr = Stream->ConnectionsToWriter[peer].RemoteStreamID;
            if (CMwrite(conn, f, Msg) != 1)
            {
                switch (Stream->Status)
                {
                case NotOpen:
                case Opening:
                case Established:
                    CP_verbose(Stream, CriticalVerbose,
                               "Message failed to send to writer %d (%p)\n", peer,
                               (void *)*WS_StreamPtr);
                    break;
                case PeerClosed:
                case PeerFailed:
                case Closed:
                case Destroyed:
                    // Don't warn on send failures for closing/closed clients
                    break;
                }
            }
        }
    }
}